

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::anon_unknown_0::NotCurrentSurfaceTest2::iterate(NotCurrentSurfaceTest2 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EGLDisplay pvVar2;
  TestLog *log;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  EGLBoolean EVar6;
  Library *egl;
  EGLConfig pvVar7;
  undefined4 extraout_var;
  int bufferAge;
  CallLogWrapper wrapper;
  EGLint damageRegion [4];
  UniqueSurface dummyPbuffer;
  EGLint attribList [5];
  string local_e8;
  string local_c8;
  undefined4 local_a4;
  CallLogWrapper local_a0;
  EGLint local_88 [4];
  ScopedLogSection local_78;
  ScopedLogSection local_70;
  ScopedLogSection local_68;
  UniqueSurface local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  
  egl = EglTestContext::getLibrary
                  ((this->super_NegativePartialUpdateTest).super_TestCase.m_eglTestCtx);
  pvVar7 = getEGLConfig(egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,SURFACETYPE_PBUFFER
                        ,false);
  local_48 = 0x3057;
  uStack_44 = 0x40;
  uStack_40 = 0x3056;
  uStack_3c = 0x40;
  local_38 = 0x3038;
  pvVar2 = (this->super_NegativePartialUpdateTest).m_eglDisplay;
  iVar4 = (*egl->_vptr_Library[10])(egl,pvVar2,pvVar7);
  eglu::UniqueSurface::UniqueSurface(&local_60,egl,pvVar2,(EGLSurface)CONCAT44(extraout_var,iVar4));
  log = ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
        m_testCtx)->m_log;
  eglu::CallLogWrapper::CallLogWrapper(&local_a0,egl,log);
  local_88[0] = 10;
  local_88[1] = 10;
  local_88[2] = 10;
  local_88[3] = 10;
  local_a4 = 0xffffffff;
  local_a0.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  (*egl->_vptr_Library[0x30])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,
             (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3095);
  dVar5 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar5,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x203);
  (*egl->_vptr_Library[0x2b])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,
             (this->super_NegativePartialUpdateTest).m_eglSurface,0x313d,&local_a4);
  dVar5 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar5,"querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x204);
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Test7","");
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,
             "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH"
             ,"");
  tcu::ScopedLogSection::ScopedLogSection(&local_68,log,&local_c8,&local_e8);
  tcu::TestLog::endSection(local_68.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  (*egl->_vptr_Library[0x27])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,local_60.m_surface,
             local_60.m_surface,(this->super_NegativePartialUpdateTest).m_eglContext);
  dVar5 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar5,"makeCurrent(m_eglDisplay, *dummyPbuffer, *dummyPbuffer, m_eglContext)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x208);
  EVar6 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                    (&local_a0,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                     (this->super_NegativePartialUpdateTest).m_eglSurface,local_88,1);
  NegativePartialUpdateTest::expectBoolean(&this->super_NegativePartialUpdateTest,0,EVar6);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Test8","");
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,
             "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH"
             ,"");
  tcu::ScopedLogSection::ScopedLogSection(&local_70,log,&local_c8,&local_e8);
  tcu::TestLog::endSection(local_70.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  (*egl->_vptr_Library[0x27])(egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,0,0,0);
  dVar5 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar5,"makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x20e);
  EVar6 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                    (&local_a0,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                     (this->super_NegativePartialUpdateTest).m_eglSurface,local_88,1);
  NegativePartialUpdateTest::expectBoolean(&this->super_NegativePartialUpdateTest,0,EVar6);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  pvVar2 = (this->super_NegativePartialUpdateTest).m_eglDisplay;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"EGL_KHR_surfaceless_context","");
  bVar3 = eglu::hasExtension(egl,pvVar2,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Test9","");
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,
               "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH"
               ,"");
    tcu::ScopedLogSection::ScopedLogSection(&local_78,log,&local_c8,&local_e8);
    tcu::TestLog::endSection(local_78.m_log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    (*egl->_vptr_Library[0x27])
              (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,0,0,
               (this->super_NegativePartialUpdateTest).m_eglContext);
    dVar5 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar5,"makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, m_eglContext)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x215);
    EVar6 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                      (&local_a0,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                       (this->super_NegativePartialUpdateTest).m_eglSurface,local_88,1);
    NegativePartialUpdateTest::expectBoolean(&this->super_NegativePartialUpdateTest,0,EVar6);
    NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  }
  eglu::CallLogWrapper::~CallLogWrapper(&local_a0);
  eglu::UniqueSurface::~UniqueSurface(&local_60);
  return STOP;
}

Assistant:

TestCase::IterateResult NotCurrentSurfaceTest2::iterate (void)
{
	const Library&				egl				= m_eglTestCtx.getLibrary();
	const EGLConfig				config			= getEGLConfig(egl, m_eglDisplay, SURFACETYPE_PBUFFER, false);
	const EGLint				attribList[]	=
	{
		EGL_WIDTH,	64,
		EGL_HEIGHT,	64,
		EGL_NONE
	};
	const eglu::UniqueSurface	dummyPbuffer	(egl, m_eglDisplay, egl.createPbufferSurface(m_eglDisplay, config, attribList));
	TestLog&					log				= m_testCtx.getLog();
	CallLogWrapper				wrapper			(egl, log);
	EGLint						damageRegion[]	= { 10, 10, 10, 10 };
	int							bufferAge		= -1;

	wrapper.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));
	EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge));

	{
		tcu::ScopedLogSection(log, "Test7", "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH");
		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, *dummyPbuffer, *dummyPbuffer, m_eglContext));
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, 1));
		expectError(EGL_BAD_MATCH);
	}
	{
		tcu::ScopedLogSection(log, "Test8", "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH");
		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, 1));
		expectError(EGL_BAD_MATCH);
	}
	if (hasExtension(egl, m_eglDisplay, "EGL_KHR_surfaceless_context"))
	{
		tcu::ScopedLogSection(log, "Test9", "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH");
		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, m_eglContext));
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, 1));
		expectError(EGL_BAD_MATCH);
	}

	return STOP;
}